

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsops.c
# Opt level: O3

LispPTR LCFetchMethodOrHelp(LispPTR object,LispPTR selector)

{
  undefined4 *puVar1;
  ulong uVar2;
  DLword *pDVar3;
  DLword *pDVar4;
  long lVar5;
  LispPTR LVar6;
  LispPTR LVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  
  uVar2 = (ulong)object;
  if (atom_instance == 0) {
    LCinit();
  }
  uVar9 = *(ushort *)((ulong)(object >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
  uVar9 = *(uint *)((long)DTDspace + (ulong)uVar9 * 4 + (ulong)(uVar9 << 5)) & 0xfffffff;
  if ((uVar9 == atom_instance) || (uVar9 == atom_class)) {
    if ((object & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar2);
    }
    pDVar3 = Lisp_world;
    uVar9 = *(uint *)(Lisp_world + uVar2);
    uVar10 = (ulong)uVar9;
    uVar8 = (ulong)(((uVar9 ^ selector) & 0x3ff) << 4);
    puVar1 = (undefined4 *)((long)&LCMethodCache->class + uVar8);
    if ((*(uint *)((long)&LCMethodCache->class + uVar8) == uVar9) && (puVar1[1] == selector)) {
      return puVar1[2];
    }
    if ((uVar9 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar10);
    }
    LVar7 = *(LispPTR *)(Lisp_world + uVar10 + 0x10);
    while( true ) {
      if ((uVar10 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar10);
      }
      pDVar4 = Lisp_world;
      uVar9 = *(uint *)(Lisp_world + uVar10 + 0x16);
      if ((ulong)uVar9 != 0) {
        if ((uVar9 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar9);
        }
        lVar5 = 0;
        while (lVar11 = lVar5, LVar6 = *(LispPTR *)((long)Lisp_world + lVar11 + (ulong)uVar9 * 2),
              LVar6 != 0) {
          lVar5 = lVar11 + 4;
          if (LVar6 == selector) {
            *puVar1 = *(undefined4 *)(pDVar3 + uVar2);
            puVar1[1] = selector;
            uVar9 = *(uint *)(pDVar4 + uVar10 + 0x18);
            if ((uVar9 & 1) != 0) {
              printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar9);
            }
            LVar7 = *(LispPTR *)((long)Lisp_world + lVar11 + (ulong)uVar9 * 2);
            puVar1[2] = LVar7;
            return LVar7;
          }
        }
      }
      LVar6 = car(LVar7);
      if (LVar6 == 0) break;
      uVar10 = (ulong)LVar6;
      LVar7 = cdr(LVar7);
    }
  }
  lcfuncall(atom_FetchMethodOrHelp_LCUFN,2,3);
  return 0xfffffffe;
}

Assistant:

LispPTR LCFetchMethodOrHelp(LispPTR object, LispPTR selector) {
  struct LCInstance *objptr;
  struct LCMethodCacheEntry *ce;
  LispPTR cur_class;

  LC_INIT;

  INSTANCE_CLASS_OR_PUNT(object, atom_FetchMethodOrHelp_LCUFN, 2);

  objptr = (struct LCInstance *)NativeAligned4FromLAddr(object);
  ce = &(LCMethodCache[METH_CACHE_INDEX((cur_class = objptr->class), selector)]);
  if (ce->class == cur_class && ce->selector == selector) return ce->method_fn;

  /* not in cache, search class then supers */
  {
    LispPTR supers = ((struct LCClass *)NativeAligned4FromLAddr(cur_class))->supers;

    for (;;) {
      int i = 0;
      LispPTR val;
      LispPTR *selectorptr;
      struct LCClass *classptr;

      classptr = (struct LCClass *)NativeAligned4FromLAddr(cur_class);
      if (classptr->selectors == NIL_PTR) {
        goto next_class;
      } else {
        selectorptr = (LispPTR *)NativeAligned4FromLAddr(classptr->selectors);
      }

      while ((val = selectorptr[i++]) != NIL_PTR) {
        if (val == selector) {
          ce->class = objptr->class;
          ce->selector = selector;
          return (ce->method_fn = ((LispPTR *)NativeAligned4FromLAddr(classptr->methods))[i - 1]);
        }
      }

    next_class:
      if ((cur_class = car(supers)) == NIL_PTR) break;
      supers = cdr(supers);
    }
  }

  /* we didn't find it at all; punt */
  RETCALL(atom_FetchMethodOrHelp_LCUFN, 2);

  /*  return lcfuncall(atom_FetchMethodOrHelp_LCUFN,2,3); */
  /*  return PUNT;*/
}